

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_dxn
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  uint32 uVar6;
  block_buffer_element *pbVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  unsigned_short *puVar10;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  vector<crnd::crn_unpacker::block_buffer_element> *in_RDI;
  uint in_R8D;
  uint16 *pAlpha1_selectors;
  uint16 *pAlpha0_selectors;
  uint32 alpha1_selector_index;
  uint32 alpha0_selector_index;
  uint8 endpoint_reference;
  block_buffer_element *buffer;
  uint32 x;
  bool visible;
  uint32 y;
  uint32 *pData;
  uint32 f;
  uint8 reference_group;
  uint32 alpha1_endpoint_index;
  uint32 alpha0_endpoint_index;
  int32 delta_pitch_in_dwords;
  uint32 height;
  uint32 width;
  uint32 num_alpha_endpoints;
  bool local_8d;
  uint32 in_stack_ffffffffffffff74;
  uint uVar11;
  byte local_61;
  uint local_54;
  uint local_4c;
  undefined4 *local_48;
  uint local_3c;
  byte local_35;
  uint32 local_34;
  uint32 local_30;
  
  uVar2 = vector<unsigned_short>::size((vector<unsigned_short> *)&in_RDI[0xd].m_size);
  uVar3 = in_ECX + 1 & 0xfffffffe;
  uVar4 = vector<crnd::crn_unpacker::block_buffer_element>::size
                    ((vector<crnd::crn_unpacker::block_buffer_element> *)&in_RDI[0xf].m_size);
  if (uVar4 < uVar3) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(in_RDI,in_stack_ffffffffffffff74);
  }
  local_30 = 0;
  local_34 = 0;
  local_35 = 0;
  local_3c = 0;
  while (uVar11 = local_3c,
        uVar5 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)((long)&in_RDI[1].m_p[2].endpoint_reference + 1)),
        uVar11 < uVar5) {
    local_48 = *(undefined4 **)(in_RSI + (ulong)local_3c * 8);
    for (local_4c = 0; local_4c < (in_R8D + 1 & 0xfffffffe); local_4c = local_4c + 1) {
      bVar1 = local_4c < in_R8D;
      for (local_54 = 0; local_54 < uVar3; local_54 = local_54 + 1) {
        local_8d = bVar1 && local_54 < in_ECX;
        if (((local_4c & 1) == 0) && ((local_54 & 1) == 0)) {
          uVar4 = symbol_codec::decode
                            ((symbol_codec *)&in_RDI[1].m_size,
                             (static_huffman_data_model *)(in_RDI + 3));
          local_35 = (byte)uVar4;
        }
        pbVar7 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           ((vector<crnd::crn_unpacker::block_buffer_element> *)&in_RDI[0xf].m_size,
                            local_54);
        if ((local_4c & 1) == 0) {
          local_61 = local_35 & 3;
          pbVar7->endpoint_reference = (byte)((int)(uint)local_35 >> 2) & 3;
          local_35 = (byte)((int)(uint)local_35 >> 4);
        }
        else {
          local_61 = (byte)pbVar7->endpoint_reference;
        }
        if (local_61 == 0) {
          uVar4 = symbol_codec::decode
                            ((symbol_codec *)&in_RDI[1].m_size,
                             (static_huffman_data_model *)&in_RDI[6].m_size);
          local_30 = uVar4 + local_30;
          if (uVar2 <= local_30) {
            local_30 = local_30 - uVar2;
          }
          pbVar7->alpha0_endpoint_index = (uint16)local_30;
          uVar4 = symbol_codec::decode
                            ((symbol_codec *)&in_RDI[1].m_size,
                             (static_huffman_data_model *)&in_RDI[6].m_size);
          local_34 = uVar4 + local_34;
          if (uVar2 <= local_34) {
            local_34 = local_34 - uVar2;
          }
          pbVar7->alpha1_endpoint_index = (uint16)local_34;
        }
        else if (local_61 == 1) {
          pbVar7->alpha0_endpoint_index = (uint16)local_30;
          pbVar7->alpha1_endpoint_index = (uint16)local_34;
        }
        else {
          local_30 = (uint32)pbVar7->alpha0_endpoint_index;
          local_34 = (uint32)pbVar7->alpha1_endpoint_index;
        }
        uVar4 = symbol_codec::decode
                          ((symbol_codec *)&in_RDI[1].m_size,
                           (static_huffman_data_model *)&in_RDI[9].m_alloc_failed);
        uVar6 = symbol_codec::decode
                          ((symbol_codec *)&in_RDI[1].m_size,
                           (static_huffman_data_model *)&in_RDI[9].m_alloc_failed);
        if (bVar1 && local_54 < in_ECX) {
          puVar8 = vector<unsigned_short>::operator[]
                             ((vector<unsigned_short> *)&in_RDI[0xe].m_size,uVar4 * 3);
          puVar9 = vector<unsigned_short>::operator[]
                             ((vector<unsigned_short> *)&in_RDI[0xe].m_size,uVar6 * 3);
          puVar10 = vector<unsigned_short>::operator[]
                              ((vector<unsigned_short> *)&in_RDI[0xd].m_size,local_30);
          *local_48 = CONCAT22(*puVar8,*puVar10);
          local_48[1] = *(undefined4 *)(puVar8 + 1);
          puVar8 = vector<unsigned_short>::operator[]
                             ((vector<unsigned_short> *)&in_RDI[0xd].m_size,local_34);
          local_48[2] = CONCAT22(*puVar9,*puVar8);
          local_48[3] = *(undefined4 *)(puVar9 + 1);
        }
        local_48 = local_48 + 4;
        bVar1 = local_8d;
      }
      local_48 = local_48 + (int)((in_EDX >> 2) + uVar3 * -4);
    }
    local_3c = local_3c + 1;
  }
  return true;
}

Assistant:

bool unpack_dxn(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 alpha0_endpoint_index = 0;
    uint32 alpha1_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 4) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha0_endpoint_index >= num_alpha_endpoints)
              alpha0_endpoint_index -= num_alpha_endpoints;
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
            alpha1_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha1_endpoint_index >= num_alpha_endpoints)
              alpha1_endpoint_index -= num_alpha_endpoints;
            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
          } else {
            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
            alpha1_endpoint_index = buffer.alpha1_endpoint_index;
          }
          uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          uint32 alpha1_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          if (visible) {
            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
            const uint16* pAlpha1_selectors = &m_alpha_selectors[alpha1_selector_index * 3];
            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
            pData[2] = m_alpha_endpoints[alpha1_endpoint_index] | (pAlpha1_selectors[0] << 16);
            pData[3] = pAlpha1_selectors[1] | (pAlpha1_selectors[2] << 16);
          }
        }
      }
    }
    return true;
  }